

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputCase10::Run(BasicInputCase10 *this)

{
  float *pfVar1;
  long lVar2;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_3> local_38;
  Vector<float,_3> local_2c;
  Vector<float,_3> local_20;
  uint local_14;
  BasicInputCase10 *pBStack_10;
  GLuint i;
  BasicInputCase10 *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x24,(void *)0x0,0x88e4);
  tcu::Vector<float,_3>::Vector(&local_20,1.0,2.0,3.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_20,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0xc,pfVar1);
  tcu::Vector<float,_3>::Vector(&local_2c,4.0,5.0,6.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_2c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0xc,pfVar1);
  tcu::Vector<float,_3>::Vector(&local_38,7.0,8.0,9.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_38,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x18,0xc,pfVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,2,0x1406,'\0',4);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,3);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo,0,0xc);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,this->m_vbo,4,8);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,1);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,0);
  (this->super_BasicInputBase).instance_count = 2;
  (this->super_BasicInputBase).base_instance = 1;
  tcu::Vector<float,_4>::Vector(&local_48,4.0,5.0,6.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_48.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_48.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_58,3.0,4.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[2].m_data = local_58.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[2].m_data + 2) = local_58.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_68,4.0,5.0,6.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_68.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_68.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_78,5.0,6.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x12].m_data = local_78.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x12].m_data + 2) =
       local_78.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_88,7.0,8.0,9.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x20].m_data = local_88.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x20].m_data + 2) =
       local_88.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_98,3.0,4.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x22].m_data = local_98.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x22].m_data + 2) =
       local_98.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_a8,7.0,8.0,9.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x30].m_data = local_a8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x30].m_data + 2) =
       local_a8.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_b8,5.0,6.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x32].m_data = local_b8.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x32].m_data + 2) =
       local_b8.m_data._8_8_;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec3) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec3), &Vec3(1.0f, 2.0f, 3.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(Vec3), &Vec3(4.0f, 5.0f, 6.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 24, sizeof(Vec3), &Vec3(7.0f, 8.0f, 9.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(2, 2, GL_FLOAT, GL_FALSE, 4);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(2, 3);
		glBindVertexBuffer(0, m_vbo, 0, 12);
		glBindVertexBuffer(3, m_vbo, 4, 8);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glVertexBindingDivisor(0, 1);
		glVertexBindingDivisor(3, 0);

		instance_count		  = 2;
		base_instance		  = 1;
		expected_data[0]	  = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[2]	  = Vec4(3.0f, 4.0f, 0.0f, 1.0f);
		expected_data[0 + 16] = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		expected_data[2 + 16] = Vec4(5.0f, 6.0f, 0.0f, 1.0f);

		expected_data[0 + 32]	  = Vec4(7.0f, 8.0f, 9.0f, 1.0f);
		expected_data[2 + 32]	  = Vec4(3.0f, 4.0f, 0.0f, 1.0f);
		expected_data[0 + 16 + 32] = Vec4(7.0f, 8.0f, 9.0f, 1.0f);
		expected_data[2 + 16 + 32] = Vec4(5.0f, 6.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}